

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void TPZFMatrix<std::complex<float>_>::MultAdd
               (complex<float> *ptr,int64_t rows,int64_t cols,TPZFMatrix<std::complex<float>_> *x,
               TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
               complex<float> alpha,complex<float> beta,int opt)

{
  size_t __n;
  ulong uVar1;
  complex<float> *pcVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  long lVar5;
  long lVar6;
  complex<float> *pcVar7;
  char *msg1;
  int64_t c;
  TPZFMatrix<std::complex<float>_> *pTVar8;
  long lVar9;
  int64_t i;
  ulong row;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar10;
  _ComplexT in_XMM1_Qa;
  float fVar11;
  complex<float> local_78;
  int local_6c;
  long local_68;
  TPZFMatrix<std::complex<float>_> *local_60;
  long local_58;
  undefined8 local_50;
  complex<float> *local_48;
  int64_t local_40;
  complex<float> local_38;
  
  fVar10 = (float)in_XMM1_Qa;
  fVar11 = (float)(in_XMM1_Qa >> 0x20);
  lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
  local_6c = (int)alpha._M_value;
  local_50 = in_XMM1_Qa;
  local_48 = ptr;
  if ((int)alpha._M_value == 0) {
    if (lVar9 != cols) goto LAB_00cb5c1a;
    if ((((fVar10 == 0.0) && (!NAN(fVar10))) && (fVar11 == 0.0)) && (!NAN(fVar11))) {
LAB_00cb594e:
      if ((int)alpha._M_value == 0) {
        uVar1 = rows;
        if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
             (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
           ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != rows)) {
          (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xe])(z);
        }
        goto LAB_00cb597f;
      }
      goto LAB_00cb5959;
    }
    if ((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow == rows)
    goto LAB_00cb593b;
  }
  else {
    if (lVar9 != rows) goto LAB_00cb5c1a;
    if (((fVar10 == 0.0) && (!NAN(fVar10))) && ((fVar11 == 0.0 && (!NAN(fVar11))))) {
LAB_00cb5959:
      uVar1 = cols;
      if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
           (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
         ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != cols)) {
        (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0xe])(z);
      }
LAB_00cb597f:
      if (cols * rows != 0) {
        lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
        __n = (uVar1 & 0xffffffff) * 8;
        lVar5 = 0;
        if (lVar9 < 1) {
          lVar9 = lVar5;
        }
        local_68 = cols;
        local_60 = y;
        local_40 = rows;
        while (lVar5 != lVar9) {
          pcVar2 = operator()(z,0,lVar5);
          local_58 = lVar5;
          if (((float)local_50 != 0.0) || (NAN((float)local_50))) {
LAB_00cb5a0e:
            if (z != local_60) {
              memcpy(pcVar2,local_60->fElem +
                            (local_60->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                            fRow * lVar5,__n);
            }
            for (row = 0; row != (uVar1 & 0xffffffff); row = row + 1) {
              for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
                pcVar2 = operator()(z,row,lVar5);
                std::complex<float>::operator*=(pcVar2,(complex<float> *)&local_50);
              }
            }
          }
          else {
            if ((local_50._4_4_ != 0.0) || (NAN(local_50._4_4_))) goto LAB_00cb5a0e;
            for (lVar5 = 0; __n - lVar5 != 0; lVar5 = lVar5 + 8) {
              *(undefined8 *)((long)&pcVar2->_M_value + lVar5) = 0;
            }
          }
          lVar5 = local_58 + 1;
        }
        pTVar8 = (TPZFMatrix<std::complex<float>_> *)0x0;
        lVar5 = local_68;
        if (local_68 < 1) {
          lVar5 = (long)pTVar8;
          local_68 = (long)pTVar8;
        }
        for (; pTVar8 != (TPZFMatrix<std::complex<float>_> *)lVar9;
            pTVar8 = (TPZFMatrix<std::complex<float>_> *)((long)pTVar8 + 1)) {
          local_60 = pTVar8;
          if (local_6c == 0) {
            for (lVar6 = 0; pTVar8 = local_60, lVar6 != lVar5; lVar6 = lVar6 + 1) {
              pcVar4 = operator()(z,0,(int64_t)local_60);
              pcVar2 = pcVar4 + local_40;
              lVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
              pcVar3 = x->fElem;
              pcVar7 = local_48 + lVar6 * local_40;
              for (; pcVar4 < pcVar2; pcVar4 = pcVar4 + 1) {
                std::operator*(&local_38,pcVar7);
                local_78._M_value = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                std::operator*(&local_78,pcVar3 + lVar5 * (long)pTVar8 + lVar6);
                pcVar4->_M_value =
                     CONCAT44((float)(pcVar4->_M_value >> 0x20) + extraout_XMM0_Db_02,
                              (float)pcVar4->_M_value + extraout_XMM0_Da_02);
                pcVar7 = pcVar7 + 1;
              }
              lVar5 = local_68;
            }
          }
          else {
            pcVar3 = operator()(z,0,(int64_t)pTVar8);
            lVar6 = 0;
            pcVar2 = local_48;
            while (lVar6 != lVar5) {
              local_78._M_value = 0;
              pcVar7 = x->fElem +
                       (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                       (long)pTVar8;
              pcVar4 = pcVar7 + local_40;
              local_58 = lVar6;
              for (; pcVar7 < pcVar4; pcVar7 = pcVar7 + 1) {
                std::operator*(pcVar2,pcVar7);
                local_78._M_value =
                     CONCAT44((float)(local_78._M_value >> 0x20) + extraout_XMM0_Db,
                              (float)local_78._M_value + extraout_XMM0_Da);
                pcVar2 = pcVar2 + 1;
              }
              std::operator*(&local_38,&local_78);
              pcVar3->_M_value =
                   CONCAT44((float)(pcVar3->_M_value >> 0x20) + extraout_XMM0_Db_00,
                            (float)pcVar3->_M_value + extraout_XMM0_Da_00);
              pcVar3 = pcVar3 + 1;
              pTVar8 = local_60;
              lVar5 = local_68;
              lVar6 = local_58 + 1;
            }
          }
        }
      }
      return;
    }
    if ((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow == cols) {
LAB_00cb593b:
      if ((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol ==
          (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) goto LAB_00cb594e;
    }
  }
  msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
LAB_00cb5c1a:
  Error(msg1,(char *)0x0);
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}